

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem-C-API.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_287390::CAPIExternalCommand::startExternalCommand
          (CAPIExternalCommand *this,BuildSystem *system,TaskInterface ti)

{
  pointer *pppBVar1;
  iterator __position;
  StringRef name_00;
  long *plVar2;
  vector<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>
  *this_00;
  ulong uVar3;
  long *plVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> name;
  BuildNode *local_58;
  long *local_50;
  size_t local_48;
  long local_40 [2];
  
  this_00 = &(this->super_ExternalCommand).super_Command.outputs;
  std::vector<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>
  ::reserve(this_00,(ulong)(this->outputNodeNames).
                           super_SmallVectorImpl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           .
                           super_SmallVectorTemplateBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                           .
                           super_SmallVectorTemplateCommon<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
                           .super_SmallVectorBase.Size);
  uVar3 = (ulong)(this->outputNodeNames).
                 super_SmallVectorImpl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 .
                 super_SmallVectorTemplateBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                 .
                 super_SmallVectorTemplateCommon<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
                 .super_SmallVectorBase.Size;
  if (uVar3 != 0) {
    plVar2 = (long *)(this->outputNodeNames).
                     super_SmallVectorImpl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     .
                     super_SmallVectorTemplateBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                     .
                     super_SmallVectorTemplateCommon<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
                     .super_SmallVectorBase.BeginX;
    plVar4 = plVar2 + uVar3 * 4;
    do {
      local_50 = local_40;
      std::__cxx11::string::_M_construct<char*>((string *)&local_50,*plVar2,plVar2[1] + *plVar2);
      name_00.Length = local_48;
      name_00.Data = (char *)local_50;
      local_58 = llbuild::buildsystem::BuildSystem::lookupNode(system,name_00);
      __position._M_current =
           (this->super_ExternalCommand).super_Command.outputs.
           super__Vector_base<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->super_ExternalCommand).super_Command.outputs.
          super__Vector_base<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<llbuild::buildsystem::BuildNode*,std::allocator<llbuild::buildsystem::BuildNode*>>::
        _M_realloc_insert<llbuild::buildsystem::BuildNode*>
                  ((vector<llbuild::buildsystem::BuildNode*,std::allocator<llbuild::buildsystem::BuildNode*>>
                    *)this_00,__position,&local_58);
      }
      else {
        *__position._M_current = local_58;
        pppBVar1 = &(this->super_ExternalCommand).super_Command.outputs.
                    super__Vector_base<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        *pppBVar1 = *pppBVar1 + 1;
      }
      if (local_50 != local_40) {
        operator_delete(local_50,local_40[0] + 1);
      }
      plVar2 = plVar2 + 4;
    } while (plVar2 != plVar4);
  }
  (*(this->cAPIDelegate).start)
            ((this->cAPIDelegate).context,(llb_buildsystem_command_t *)this,
             (llb_buildsystem_interface_t *)system,(llb_task_interface_t)ti);
  return;
}

Assistant:

virtual void startExternalCommand(BuildSystem& system,
                                    core::TaskInterface ti) override {
    outputs.reserve(outputNodeNames.size());
    for (auto name: outputNodeNames) {
      outputs.push_back(system.lookupNode(name));
    }
    cAPIDelegate.start(cAPIDelegate.context,
                       (llb_buildsystem_command_t*)this,
                       (llb_buildsystem_interface_t*)&system,
                       *reinterpret_cast<llb_task_interface_t*>(&ti));
  }